

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  
  Align(this,other);
  sVar1 = other->exponent_;
  sVar2 = this->exponent_;
  uVar3 = other->used_bigits_;
  uVar6 = 0;
  if ((short)uVar3 < 1) {
    uVar3 = 0;
  }
  lVar4 = (long)sVar1 * 4 + (long)sVar2 * -4 + 4;
  uVar7 = 0;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    uVar7 = *(int *)((long)this + uVar6 * 4 + lVar4) - (uVar7 + other->bigits_buffer_[uVar6]);
    *(uint *)((long)this + uVar6 * 4 + lVar4) = uVar7 & 0xfffffff;
    uVar7 = uVar7 >> 0x1f;
  }
  puVar5 = (uint *)((long)this + (((long)sVar1 + (ulong)uVar3) - (long)sVar2) * 4);
  for (; puVar5 = puVar5 + 1, uVar7 != 0; uVar7 = uVar7 - 1 >> 0x1f) {
    uVar7 = *puVar5;
    *puVar5 = uVar7 - 1 & 0xfffffff;
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  DOUBLE_CONVERSION_ASSERT(LessEqual(other, *this));

  Align(other);

  const int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_bigits_; ++i) {
    DOUBLE_CONVERSION_ASSERT((borrow == 0) || (borrow == 1));
    const Chunk difference = RawBigit(i + offset) - other.RawBigit(i) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    const Chunk difference = RawBigit(i + offset) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}